

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDeps
          (DescriptorBuilder *this,string_view name,bool build_it)

{
  bool bVar1;
  FileDescriptor *local_48;
  FileDescriptor *file;
  char *local_38;
  undefined1 local_29;
  DescriptorBuilder *pDStack_28;
  bool build_it_local;
  DescriptorBuilder *this_local;
  string_view name_local;
  Symbol result;
  
  local_38 = name._M_str;
  file = (FileDescriptor *)name._M_len;
  local_29 = build_it;
  pDStack_28 = this;
  this_local = (DescriptorBuilder *)file;
  name_local._M_len = (size_t)local_38;
  name_local._M_str = (char *)FindSymbolNotEnforcingDepsHelper(this,this->pool_,name,build_it);
  local_48 = Symbol::GetFile((Symbol *)&name_local._M_str);
  if (((local_48 == this->file_) ||
      (bVar1 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
               ::contains<google::protobuf::FileDescriptor_const*>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                           *)&this->dependencies_,&local_48), bVar1)) &&
     (bVar1 = Symbol::IsPackage((Symbol *)&name_local._M_str), !bVar1)) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::erase<google::protobuf::FileDescriptor_const*>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                *)&this->unused_dependency_,&local_48);
  }
  return (Symbol)(SymbolBase *)name_local._M_str;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDeps(
    const absl::string_view name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDepsHelper(pool_, name, build_it);
  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if ((file == file_ || dependencies_.contains(file)) && !result.IsPackage()) {
    unused_dependency_.erase(file);
  }
  return result;
}